

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O1

string * __thiscall
argvParser::generateMarkdownArgumentOverview_abi_cxx11_
          (string *__return_storage_ptr__,argvParser *this)

{
  uint __val;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar7;
  undefined8 *puVar8;
  pointer ppsVar9;
  undefined8 uVar10;
  long *plVar11;
  size_type *psVar12;
  bool bVar13;
  uint __len;
  argvParser *paVar14;
  ulong uVar15;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string req;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  argvParser *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  ulong local_58;
  char *local_50 [2];
  char local_40 [16];
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_b0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  std::operator+(&local_d0,"# ",&(this->super_argParserAdvancedConfiguration).applicationName);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_78 = &local_68;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_68 = *plVar11;
    lStack_60 = plVar6[3];
  }
  else {
    local_68 = *plVar11;
    local_78 = (long *)*plVar6;
  }
  local_70 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"## Required arguments: \n","");
  pvVar7 = (this->super_argParserAdvancedConfiguration).newargconfig;
  local_88 = this;
  if ((pvVar7->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (pvVar7->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 0;
    bVar13 = false;
    do {
      pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
      ppsVar9 = (pvVar7->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pvVar7->
                        super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3) <= uVar16)
      {
LAB_00107f4b:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar16);
        goto LAB_00107f5c;
      }
      uVar15 = 0;
      while (lVar1 = *(long *)&(ppsVar9[uVar16]->arguments->
                               super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                               )._M_impl.super__Vector_impl_data,
            uVar15 < (ulong)((long)*(pointer *)
                                    ((long)&(ppsVar9[uVar16]->arguments->
                                            super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                            )._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3)) {
        lVar1 = *(long *)(lVar1 + uVar15 * 8);
        if (*(char *)(lVar1 + 0xe8) == '\x01') {
          if (!bVar13) {
            bVar13 = true;
            std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_78);
          }
          std::operator+(&local_a8," * ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar1 + 0x20));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar12 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0.field_2._8_8_ = plVar6[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_d0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        uVar15 = uVar15 + 1;
        pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
        ppsVar9 = (pvVar7->
                  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar7->
                          super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3) <=
            uVar16) goto LAB_00107f4b;
      }
      uVar16 = uVar16 + 1;
      pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
    } while (uVar16 < (ulong)((long)(pvVar7->
                                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar7->
                                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__cxx11::string::append((char *)local_b0);
  pvVar7 = (local_88->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar9 = (pvVar7->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar7->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppsVar9) {
    uVar16 = 0;
    paVar14 = local_88;
    do {
      if ((ppsVar9[uVar16]->sectionName)._M_string_length != 0) {
        ppsVar9 = (pvVar7->
                  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar7->
                          super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3) <=
            uVar16) goto LAB_00107f6d;
        std::operator+(&local_a8,"### ",&ppsVar9[uVar16]->sectionName);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_d0._M_string_length = puVar8[1];
        *puVar8 = psVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      pvVar7 = (paVar14->super_argParserAdvancedConfiguration).newargconfig;
      ppsVar9 = (pvVar7->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pvVar7->
                        super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3) <= uVar16)
      goto LAB_00107f5c;
      uVar15 = 0;
      local_58 = uVar16;
      while (lVar1 = *(long *)&(ppsVar9[local_58]->arguments->
                               super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                               )._M_impl.super__Vector_impl_data,
            uVar15 < (ulong)((long)*(pointer *)
                                    ((long)&(ppsVar9[local_58]->arguments->
                                            super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                            )._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3)) {
        __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (lVar1 + uVar15 * 8);
        std::operator+(&local_a8,"#### ",__rhs + 1);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar12 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        pcVar2 = __rhs[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + __rhs[2]._M_string_length);
        std::__cxx11::string::append((char *)&local_d0);
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        pcVar2 = __rhs[3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + __rhs[3]._M_string_length);
        std::__cxx11::string::append((char *)&local_d0);
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        std::operator+(&local_a8,"    short: ",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar12 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        std::operator+(&local_a8,"    long : ",__rhs + 1);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_d0._M_string_length = puVar8[1];
        *puVar8 = psVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        __val = *(uint *)((long)&__rhs[7]._M_string_length + 4);
        if (0 < (int)__val) {
          __len = 1;
          if (9 < __val) {
            uVar4 = __val;
            uVar3 = 4;
            do {
              __len = uVar3;
              if (uVar4 < 100) {
                __len = __len - 2;
                goto LAB_00107ca3;
              }
              if (uVar4 < 1000) {
                __len = __len - 1;
                goto LAB_00107ca3;
              }
              if (uVar4 < 10000) goto LAB_00107ca3;
              bVar13 = 99999 < uVar4;
              uVar4 = uVar4 / 10000;
              uVar3 = __len + 4;
            } while (bVar13);
            __len = __len + 1;
          }
LAB_00107ca3:
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct((ulong)local_50,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],__len,__val);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10d257);
          paVar14 = local_88;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          psVar12 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_a8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = psVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
        iVar5 = std::__cxx11::string::compare((char *)(__rhs + 4));
        if (iVar5 != 0) {
          std::operator+(&local_a8,"allowed parameter: ",__rhs + 4);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = psVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        if ((char)__rhs[7]._M_string_length == '\x01') {
          std::__cxx11::string::append((char *)local_b0);
        }
        uVar15 = uVar15 + 1;
        pvVar7 = (paVar14->super_argParserAdvancedConfiguration).newargconfig;
        ppsVar9 = (pvVar7->
                  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar16 = local_58;
        if ((ulong)((long)(pvVar7->
                          super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3) <=
            local_58) goto LAB_00107f5c;
      }
      uVar16 = local_58 + 1;
      pvVar7 = (paVar14->super_argParserAdvancedConfiguration).newargconfig;
      ppsVar9 = (pvVar7->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(pvVar7->
                                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3
                             ));
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return local_b0;
LAB_00107f5c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
LAB_00107f6d:
  uVar10 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar16);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  pcVar2 = (local_b0->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != local_80) {
    operator_delete(pcVar2);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

string argvParser::generateMarkdownArgumentOverview() {

  string md = "";

  md += "# "+ applicationName + "\n";
    string req =  "## Required arguments: \n";
    bool hasReq = false;

  for(int i = 0; i< newargconfig->size();i++) {
      for(int x = 0; x< newargconfig->at(i)->arguments->size();x++) {
          argument * arg = newargconfig->at(i)->arguments->at(x);
          if(arg->requiredAndNotHitJet){
              if(!hasReq){
                  hasReq = true;
                  md += req;
              }
              md += " * " +  arg->argLong + "\n";
          }
    }
  }
  md+= "## Application Arguments \n";
      for(int i = 0; i< newargconfig->size();i++) {
          if (!newargconfig->at(i)->sectionName.empty()) {
              md += "### " + newargconfig->at(i)->sectionName + "\n";
          }
          for (int x = 0; x < newargconfig->at(i)->arguments->size(); x++) {
              argument *arg = newargconfig->at(i)->arguments->at(x);
              md += "#### " + arg->argLong + "\n";
              md += arg->helpMessage + "\n\n";
              md += arg->additionalHelp + "\n\n";
              md += "    short: " + arg->argShort + " \n";
              md += "    long : " + arg->argLong + " \n\n";
              if (arg->numberOfArguments > 0)
                  md += "number of additional parameter: " + to_string(arg->numberOfArguments) + " \n \n ";
              if (arg->enums != "") {
                  md += "allowed parameter: " + arg->enums + "\n";
              }
              if (arg->requiredAndNotHitJet) {
                  md += "This argument is requires \n";
              }

          }
      }
    return md;
}